

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.h
# Opt level: O2

Vector3f * phyr::reflect(Vector3f *__return_storage_ptr__,Vector3f *wo,Vector3f *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = wo->z;
  dVar4 = wo->x;
  dVar5 = wo->y;
  dVar6 = dot<double>(wo,n);
  dVar6 = dVar6 + dVar6;
  dVar3 = n->y;
  dVar2 = n->z;
  __return_storage_ptr__->x = dVar6 * n->x - dVar4;
  __return_storage_ptr__->y = dVar6 * dVar3 - dVar5;
  __return_storage_ptr__->z = dVar6 * dVar2 - dVar1;
  return __return_storage_ptr__;
}

Assistant:

inline Vector3f reflect(const Vector3f& wo, const Vector3f& n) {
    return -wo + 2 * dot(wo, n) * n;
}